

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O1

void __thiscall
TEST_FailableMemoryAllocator_CheckAllFailingAllocsWereDone_Test::testBody
          (TEST_FailableMemoryAllocator_CheckAllFailingAllocsWereDone_Test *this)

{
  TestTestingFixture *this_00;
  UtestShell *pUVar1;
  size_t sVar2;
  TestTerminator *pTVar3;
  SimpleString local_30;
  
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).testFunction.testFunction_ =
       failingAllocIsNeverDone_;
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).fixture;
  TestTestingFixture::runAllTests(this_00);
  pUVar1 = UtestShell::getCurrent();
  sVar2 = TestTestingFixture::getFailureCount(this_00);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0xe])
            (pUVar1,1,sVar2,"LONGS_EQUAL(1, fixture.getFailureCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x118,pTVar3);
  SimpleString::SimpleString(&local_30,"Expected allocation number 3 was never done");
  TestTestingFixture::assertPrintContains(this_00,&local_30);
  SimpleString::~SimpleString(&local_30);
  (*(((this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).failableMallocAllocator)->
    super_TestMemoryAllocator)._vptr_TestMemoryAllocator[0xe])();
  return;
}

Assistant:

TEST(FailableMemoryAllocator, CheckAllFailingAllocsWereDone)
{
    testFunction.testFunction_ = failingAllocIsNeverDone_;

    fixture.runAllTests();

    LONGS_EQUAL(1, fixture.getFailureCount());
    fixture.assertPrintContains("Expected allocation number 3 was never done");
    failableMallocAllocator->clearFailedAllocs();
}